

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O3

int lyd_list_equal(lyd_node *first,lyd_node *second,int action,int withdefaults,int log)

{
  LYS_NODE LVar1;
  lys_node *plVar2;
  char *__s1;
  int iVar3;
  int iVar4;
  char *__string;
  LY_ERR *pLVar5;
  lyd_node *plVar6;
  lyd_node *plVar7;
  char *path;
  char *path_00;
  uint8_t *puVar8;
  lys_ext_instance **pplVar9;
  size_t sVar10;
  lys_node *node;
  lys_node *plVar11;
  uint8_t *puVar12;
  uint uVar13;
  char *pcVar14;
  ulong uVar15;
  ulong uVar16;
  lyd_node *elem;
  lys_ext *__s;
  uint8_t *__s_00;
  char *local_88;
  uint16_t local_4e;
  int local_4c;
  uint16_t idx1;
  lyd_node *plStack_48;
  uint8_t *local_40;
  uint16_t local_32 [4];
  uint16_t idx2;
  
  __string = ly_buf();
  if (first != (lyd_node *)0x0) {
    plVar2 = first->schema;
    LVar1 = plVar2->nodetype;
    if ((LVar1 & (LYS_LIST|LYS_LEAFLIST)) != LYS_UNKNOWN) {
      if (second != (lyd_node *)0x0) {
        plVar11 = second->schema;
        if ((plVar11->nodetype & (LYS_LIST|LYS_LEAFLIST)) != LYS_UNKNOWN) {
          if (LVar1 != plVar11->nodetype) {
            __assert_fail("first->schema->nodetype == second->schema->nodetype",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                          ,0x143e,
                          "int lyd_list_equal(struct lyd_node *, struct lyd_node *, int, int, int)")
            ;
          }
          if (plVar2 != plVar11) {
            return 0;
          }
          if (LVar1 != LYS_LIST) {
            if (LVar1 != LYS_LEAFLIST) {
              pLVar5 = ly_errno_location();
              *pLVar5 = LY_EINT;
              ly_log(LY_LLERR,"Internal error (%s:%d).",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                     ,0x14d3);
              return -1;
            }
            if (((plVar2->flags & 2) != 0) && ((plVar2->module->field_0x40 & 0xc) != 0)) {
              return 0;
            }
            if (first->child != second->child) {
              return 0;
            }
            if ((withdefaults != 0) && (((second->field_0x9 ^ first->field_0x9) & 1) != 0)) {
              return 0;
            }
            if (log != 0) {
              ly_vlog(LYE_DUPLEAFLIST,LY_VLOG_LYD,second,plVar11->name);
              return 1;
            }
            return 1;
          }
          if (action != 0) {
            uVar13 = 0;
            plStack_48 = second;
            if (action < 1) goto LAB_00161b8c;
            if ((uint)plVar2->padding[3] < (uint)action) goto LAB_00161b8c;
            uVar13 = action - 1;
            do {
              puVar12 = (uint8_t *)(ulong)uVar13;
              pplVar9 = plVar2[1].ext;
              if (*(char *)(pplVar9 + (long)puVar12 * 2 + 1) != '\0') {
                uVar16 = 0;
                local_40 = puVar12;
                do {
                  plVar6 = resolve_data_descendant_schema_nodeid
                                     ((char *)(&pplVar9[(long)puVar12 * 2]->def)[uVar16],
                                      first->child);
                  if (plVar6 == (lyd_node *)0x0) {
                    plVar6 = (lyd_node *)
                             lyd_get_unique_default
                                       ((char *)(&plVar2[1].ext[(long)puVar12 * 2]->def)[uVar16],
                                        first);
                    pLVar5 = ly_errno_location();
                    if (*pLVar5 != LY_SUCCESS) {
                      return -1;
                    }
                  }
                  else {
                    plVar6 = plVar6->child;
                  }
                  plVar7 = resolve_data_descendant_schema_nodeid
                                     ((char *)(&plVar2[1].ext[(long)puVar12 * 2]->def)[uVar16],
                                      second->child);
                  if (plVar7 == (lyd_node *)0x0) {
                    plVar7 = (lyd_node *)
                             lyd_get_unique_default
                                       ((char *)(&plVar2[1].ext[(long)puVar12 * 2]->def)[uVar16],
                                        second);
                    pLVar5 = ly_errno_location();
                    if (*pLVar5 != LY_SUCCESS) {
                      return -1;
                    }
                  }
                  else {
                    plVar7 = plVar7->child;
                  }
                  elem = plStack_48;
                  second = plStack_48;
                  if (((plVar6 == (lyd_node *)0x0) || (plVar7 == (lyd_node *)0x0)) ||
                     (plVar6 != plVar7)) break;
                  uVar16 = uVar16 + 1;
                  pplVar9 = plVar2[1].ext;
                } while (uVar16 < *(byte *)(pplVar9 + (long)puVar12 * 2 + 1));
                uVar13 = (uint)local_40;
                if (((uint)uVar16 != 0) &&
                   ((uint)uVar16 == (uint)*(byte *)(plVar2[1].ext + (long)puVar12 * 2 + 1))) {
                  if (log == 0) {
                    return 1;
                  }
                  path = (char *)malloc(0x400);
                  path_00 = (char *)malloc(0x400);
                  if (path == (char *)0x0 || path_00 == (char *)0x0) {
                    pLVar5 = ly_errno_location();
                    *pLVar5 = LY_EMEM;
                    ly_log(LY_LLERR,"Memory allocation failed (%s()).","lyd_list_equal");
                    free(path);
                    free(path_00);
                    return -1;
                  }
                  local_32[0] = 0x3ff;
                  local_4e = 0x3ff;
                  path[0x3ff] = '\0';
                  path_00[0x3ff] = '\0';
                  ly_vlog_build_path_reverse(LY_VLOG_LYD,first,path,&local_4e,0);
                  ly_vlog_build_path_reverse(LY_VLOG_LYD,elem,path_00,local_32,0);
                  puVar8 = ly_buf_used_location();
                  if ((*puVar8 == '\0') || (*__string == '\0')) {
                    local_88 = (char *)0x0;
                  }
                  else {
                    local_88 = strndup(__string,0x3ff);
                  }
                  puVar8 = ly_buf_used_location();
                  *puVar8 = *puVar8 + '\x01';
                  pplVar9 = plVar2[1].ext;
                  if (*(char *)(pplVar9 + (long)puVar12 * 2 + 1) != '\0') {
                    uVar16 = 0;
                    uVar15 = 0;
                    do {
                      if (uVar16 != 0) {
                        __string[uVar15 & 0xffff] = ' ';
                        pplVar9 = plVar2[1].ext;
                        uVar15 = (ulong)((int)uVar15 + 1);
                      }
                      __s = (&pplVar9[(long)puVar12 * 2]->def)[uVar16];
                      local_4c = 0;
                      plVar11 = first->schema;
                      do {
                        puVar8 = (uint8_t *)strchr((char *)__s,0x2f);
                        if (puVar8 == (uint8_t *)0x0) {
                          sVar10 = strlen((char *)__s);
                          puVar8 = __s->padding + (sVar10 - 0x1b);
                        }
                        local_40 = puVar8;
                        node = lys_getnext((lys_node *)0x0,plVar11,(lys_module *)0x0,3);
                        if (node == (lys_node *)0x0) {
LAB_00162010:
                          pLVar5 = ly_errno_location();
                          *pLVar5 = LY_EINT;
                          ly_log(LY_LLERR,"Internal error (%s:%d).",
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                                 ,0x1419);
                          elem = plStack_48;
                          iVar4 = 0xffff;
                          break;
                        }
                        sVar10 = (long)local_40 - (long)__s;
                        while( true ) {
                          __s1 = node->name;
                          iVar3 = strncmp(__s1,(char *)__s,sVar10);
                          iVar4 = local_4c;
                          if ((iVar3 == 0) && (__s1[sVar10] == '\0')) break;
                          node = lys_getnext(node,plVar11,(lys_module *)0x0,3);
                          if (node == (lys_node *)0x0) goto LAB_00162010;
                        }
                        if (node->nodetype == LYS_LIST) {
                          __assert_fail("snode->nodetype != LYS_LIST",
                                        "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                                        ,0x1408,
                                        "int lyd_build_relative_data_path(const struct lyd_node *, const char *, char *)"
                                       );
                        }
                        if ((node->nodetype & (LYS_CASE|LYS_CHOICE)) == LYS_UNKNOWN) {
                          pcVar14 = "/";
                          if (local_4c == 0) {
                            pcVar14 = "";
                          }
                          local_4c = sprintf(__string + (long)local_4c + (uVar15 & 0xffff),"%s%s",
                                             pcVar14,__s1);
                          local_4c = local_4c + iVar4;
                        }
                        elem = plStack_48;
                        plVar11 = lys_parent(node);
                        puVar8 = local_40;
                        if (((plVar11 != (lys_node *)0x0) &&
                            (plVar11 = lys_parent(node), puVar8 = local_40,
                            plVar11->nodetype == LYS_CHOICE)) && (node->nodetype != LYS_CASE)) {
                          __s_00 = local_40 + 1;
                          puVar8 = (uint8_t *)strchr((char *)__s_00,0x2f);
                          if (puVar8 == (uint8_t *)0x0) {
                            sVar10 = strlen((char *)__s_00);
                            puVar8 = __s_00 + sVar10;
                          }
                        }
                        __s = (lys_ext *)(puVar8 + 1);
                        plVar11 = node;
                        iVar4 = local_4c;
                      } while (*puVar8 != '\0');
                      uVar15 = (ulong)(uint)((int)uVar15 + iVar4);
                      uVar16 = uVar16 + 1;
                      pplVar9 = plVar2[1].ext;
                    } while (uVar16 < *(byte *)(pplVar9 + (long)puVar12 * 2 + 1));
                  }
                  ly_vlog(LYE_NOUNIQ,LY_VLOG_LYD,elem,__string,path + local_4e,path_00 + local_32[0]
                         );
                  free(path);
                  free(path_00);
                  if (local_88 != (char *)0x0) {
                    strcpy(__string,local_88);
                    free(local_88);
                  }
                  puVar12 = ly_buf_used_location();
                  *puVar12 = *puVar12 + 0xff;
                  return 1;
                }
              }
              if (0 < action) {
                return 0;
              }
              uVar13 = uVar13 + 1;
LAB_00161b8c:
            } while ((int)uVar13 < (int)(uint)plVar2->padding[3]);
          }
          if ((ulong)plVar2->padding[2] == 0) {
            return 0;
          }
          uVar16 = 0;
LAB_00161cd7:
          plVar11 = *(lys_node **)(*(long *)&plVar2[1].flags + uVar16 * 8);
          for (plVar6 = first->child; plVar7 = second->child, plVar6 != (lyd_node *)0x0;
              plVar6 = plVar6->next) {
            if (plVar6->schema == plVar11) {
              plVar6 = plVar6->child;
              goto joined_r0x00161cfd;
            }
          }
          plVar6 = (lyd_node *)0x0;
joined_r0x00161cfd:
          do {
            if (plVar7 == (lyd_node *)0x0) goto LAB_00161d10;
            if (plVar7->schema == plVar11) {
              plVar7 = plVar7->child;
              goto LAB_00161d19;
            }
            plVar7 = plVar7->next;
          } while( true );
        }
      }
      __assert_fail("second && (second->schema->nodetype & (LYS_LIST | LYS_LEAFLIST))",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                    ,0x143d,
                    "int lyd_list_equal(struct lyd_node *, struct lyd_node *, int, int, int)");
    }
  }
  __assert_fail("first && (first->schema->nodetype & (LYS_LIST | LYS_LEAFLIST))",
                "/workspace/llm4binary/github/license_all_cmakelists_25/RIFTIO[P]libyang/src/tree_data.c"
                ,0x143c,"int lyd_list_equal(struct lyd_node *, struct lyd_node *, int, int, int)");
LAB_00161d10:
  plVar7 = (lyd_node *)0x0;
LAB_00161d19:
  if (plVar6 != plVar7) {
    return 0;
  }
  uVar16 = uVar16 + 1;
  if (uVar16 == plVar2->padding[2]) {
    if (log != 0) {
      ly_vlog(LYE_DUPLIST,LY_VLOG_LYD,second,second->schema->name);
    }
    return 1;
  }
  goto LAB_00161cd7;
}

Assistant:

int
lyd_list_equal(struct lyd_node *first, struct lyd_node *second, int action, int withdefaults, int log)
{
    struct lys_node_list *slist;
    const struct lys_node *snode = NULL;
    struct lyd_node *diter;
    const char *val1, *val2;
    char *path1, *path2, *uniq_str = ly_buf(), *buf_backup = NULL;
    uint16_t idx1, idx2, idx_uniq;
    int i, j;

    assert(first && (first->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)));
    assert(second && (second->schema->nodetype & (LYS_LIST | LYS_LEAFLIST)));
    assert(first->schema->nodetype == second->schema->nodetype);

    if (first->schema != second->schema) {
        return 0;
    }

    switch (first->schema->nodetype) {
    case LYS_LEAFLIST:
        if ((first->schema->flags & LYS_CONFIG_R) && first->schema->module->version >= 2) {
            /* same values are allowed for status data */
            return 0;
        }
        /* compare values */
        if (ly_strequal(((struct lyd_node_leaf_list *)first)->value_str,
                        ((struct lyd_node_leaf_list *)second)->value_str, 1)
                && (!withdefaults || (first->dflt == second->dflt))) {
            if (log) {
                LOGVAL(LYE_DUPLEAFLIST, LY_VLOG_LYD, second, second->schema->name,
                       ((struct lyd_node_leaf_list *)second)->value_str);
            }
            return 1;
        }
        return 0;
    case LYS_LIST:
        slist = (struct lys_node_list *)first->schema;

        /* compare unique leafs */
        if (action) {
            if (action > 0) {
                i = action - 1;
                if (i < slist->unique_size) {
                    goto uniquecheck;
                }
            }
            for (i = 0; i < slist->unique_size; i++) {
uniquecheck:
                for (j = 0; j < slist->unique[i].expr_size; j++) {
                    /* first */
                    diter = resolve_data_descendant_schema_nodeid(slist->unique[i].expr[j], first->child);
                    if (diter) {
                        val1 = ((struct lyd_node_leaf_list *)diter)->value_str;
                    } else {
                        /* use default value */
                        val1 = lyd_get_unique_default(slist->unique[i].expr[j], first);
                        if (ly_errno) {
                            return -1;
                        }
                    }

                    /* second */
                    diter = resolve_data_descendant_schema_nodeid(slist->unique[i].expr[j], second->child);
                    if (diter) {
                        val2 = ((struct lyd_node_leaf_list *)diter)->value_str;
                    } else {
                        /* use default value */
                        val2 = lyd_get_unique_default(slist->unique[i].expr[j], second);
                        if (ly_errno) {
                            return -1;
                        }
                    }

                    if (!val1 || !val2 || !ly_strequal(val1, val2, 1)) {
                        /* values differ */
                        break;
                    }
                }
                if (j && (j == slist->unique[i].expr_size)) {
                    /* all unique leafs are the same in this set, create this nice error */
                    if (!log) {
                        return 1;
                    }

                    path1 = malloc(LY_BUF_SIZE);
                    path2 = malloc(LY_BUF_SIZE);
                    if (!path1 || !path2) {
                        LOGMEM;
                        free(path1);
                        free(path2);
                        return -1;
                    }
                    idx1 = idx2 = LY_BUF_SIZE - 1;
                    path1[idx1] = '\0';
                    path2[idx2] = '\0';
                    ly_vlog_build_path_reverse(LY_VLOG_LYD, first, path1, &idx1, 0);
                    ly_vlog_build_path_reverse(LY_VLOG_LYD, second, path2, &idx2, 0);

                    /* use internal buffer to rebuild the unique string */
                    if (ly_buf_used && uniq_str[0]) {
                        buf_backup = strndup(uniq_str, LY_BUF_SIZE - 1);
                    }
                    ly_buf_used++;
                    idx_uniq = 0;

                    for (j = 0; j < slist->unique[i].expr_size; ++j) {
                        if (j) {
                            uniq_str[idx_uniq++] = ' ';
                        }
                        idx_uniq += lyd_build_relative_data_path(first, slist->unique[i].expr[j], &uniq_str[idx_uniq]);
                    }

                    LOGVAL(LYE_NOUNIQ, LY_VLOG_LYD, second, uniq_str, &path1[idx1], &path2[idx2]);
                    free(path1);
                    free(path2);
                    if (buf_backup) {
                        strcpy(uniq_str, buf_backup);
                        free(buf_backup);
                    }
                    ly_buf_used--;
                    return 1;
                }

                if (action > 0) {
                    /* done */
                    return 0;
                }
            }
        }

        /* compare keys */
        if (!slist->keys_size) {
            /* status lists without keys */
            return 0;
        } else {
            for (i = 0; i < slist->keys_size; i++) {
                snode = (struct lys_node *)slist->keys[i];
                val1 = val2 = NULL;
                LY_TREE_FOR(first->child, diter) {
                    if (diter->schema == snode) {
                        val1 = ((struct lyd_node_leaf_list *)diter)->value_str;
                        break;
                    }
                }
                LY_TREE_FOR(second->child, diter) {
                    if (diter->schema == snode) {
                        val2 = ((struct lyd_node_leaf_list *)diter)->value_str;
                        break;
                    }
                }
                if (!ly_strequal(val1, val2, 1)) {
                    return 0;
                }
            }
        }

        if (log) {
            LOGVAL(LYE_DUPLIST, LY_VLOG_LYD, second, second->schema->name);
        }
        return 1;
    default:
        LOGINT;
        return -1;
    }
}